

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  ushort uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  CType *pCVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  GCstr *pGVar8;
  cTValue *tv;
  uint64_t *puVar9;
  uint id;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  CTState *cts;
  uint64_t *sp;
  char *fmt;
  
  pTVar2 = L->base;
  pTVar3 = L->top;
  if ((pTVar3 <= pTVar2) || ((pTVar2->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar1 = *(ushort *)((ulong)(pTVar2->u32).lo + 6);
  id = (uint)uVar1;
  sp = (uint64_t *)((ulong)(pTVar2->u32).lo + 8);
  uVar10 = (uint)uVar1;
  puVar9 = sp;
  if (uVar10 == 0x15) {
    id = *(uint *)sp;
    fmt = "ctype<%s>";
    goto LAB_00120930;
  }
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pCVar4 = cts->tab;
  uVar11 = (ulong)uVar10 * 0x10;
  uVar10 = pCVar4[uVar10].info;
  if ((uVar10 & 0xf0800000) == 0x20800000) {
    uVar11 = (ulong)((uVar10 & 0xffff) << 4);
    uVar10 = *(uint *)((long)&pCVar4->info + uVar11);
    puVar9 = (uint64_t *)*sp;
  }
  lVar12 = (long)&pCVar4->info + uVar11;
  if ((uVar10 & 0xf4000000) == 0x34000000) {
    pGVar8 = lj_ctype_repr_complex(L,sp,*(CTSize *)(lVar12 + 4));
    uVar6 = (uint32_t)pGVar8;
  }
  else {
    if ((0x3ffffff < uVar10) || (*(int *)(lVar12 + 4) != 8)) {
      uVar5 = uVar10 >> 0x1c;
      if (uVar5 == 2) {
        if (*(int *)(lVar12 + 4) == 4) {
          puVar9 = (uint64_t *)(ulong)(uint)*puVar9;
        }
        else {
          puVar9 = (uint64_t *)*puVar9;
        }
        uVar11 = (ulong)((uVar10 & 0xffff) << 4);
        uVar10 = *(uint *)((long)&pCVar4->info + uVar11);
        lVar12 = (long)&pCVar4->info + uVar11;
LAB_00120a98:
        fmt = "cdata<%s>: %p";
        if ((((uVar10 & 0xf0000000) == 0x10000000) || ((uVar10 & 0xf8000000) == 0x38000000)) &&
           (tv = lj_ctype_meta(cts,(CTypeID)((ulong)(lVar12 - (long)pCVar4) >> 4),MM_tostring),
           tv != (cTValue *)0x0)) {
          iVar7 = lj_meta_tailcall(L,tv);
          return iVar7;
        }
      }
      else if (uVar5 == 5) {
        puVar9 = (uint64_t *)(ulong)(uint)*puVar9;
        fmt = "cdata<%s>: %d";
      }
      else {
        if (uVar5 != 6) goto LAB_00120a98;
        puVar9 = (uint64_t *)*puVar9;
        fmt = "cdata<%s>: %p";
      }
LAB_00120930:
      pGVar8 = lj_ctype_repr(L,id,(GCstr *)0x0);
      lj_strfmt_pushf(L,fmt,pGVar8 + 1,puVar9);
      goto LAB_00120a08;
    }
    pGVar8 = lj_ctype_repr_int64(L,*sp,uVar10 & 0x800000);
    uVar6 = (uint32_t)pGVar8;
  }
  pTVar3[-1].u32.lo = uVar6;
  *(undefined4 *)((long)pTVar3 - 4) = 0xfffffffb;
LAB_00120a08:
  uVar11 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar11 + 0x54) <= *(uint *)(uVar11 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t *)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}